

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Sintatico::parametros_formais(Sintatico *this)

{
  bool bVar1;
  int token_consumir;
  
  bVar1 = Tokens::isEqual((Tokens *)this,this->tok,0xc);
  token_consumir = 0x19;
  if (bVar1) {
    eat(this,0xc);
    parametro_expressao(this);
    bVar1 = Tokens::isEqual((Tokens *)this,this->tok,0x15);
    token_consumir = 0xd;
    while (bVar1 != false) {
      eat(this,0x15);
      parametro_expressao(this);
      bVar1 = Tokens::isEqual((Tokens *)this,this->tok,0x15);
    }
  }
  eat(this,token_consumir);
  return;
}

Assistant:

void Sintatico::parametros_formais() {
  if (isEqual(tok, ABREPAR)){
    eat(ABREPAR);
    parametro_formal();
    while (isEqual(tok, PONTOVIRGULA)) {
      eat(PONTOVIRGULA);
      parametro_formal();
    }
    eat(FECHAPAR);
  } else eat(ABREFECHAPAR);
}